

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_object_pool.h
# Opt level: O0

pointer __thiscall
Gudhi::
Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>::
construct<unsigned_int&,int&,Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned_int,int>*&>
          (Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
           *this,uint *u,int *u_1,Persistent_cohomology_column<unsigned_int,_int> **u_2)

{
  Base *this_00;
  Persistent_cohomology_cell<unsigned_int,_int> *this_01;
  uint *__size;
  void *p;
  Persistent_cohomology_column<unsigned_int,_int> **u_local_2;
  int *u_local_1;
  uint *u_local;
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
  *this_local;
  
  __size = u;
  this_00 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
            ::base((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
                    *)this);
  this_01 = (Persistent_cohomology_cell<unsigned_int,_int> *)
            boost::pool<boost::default_user_allocator_malloc_free>::malloc(this_00,(size_t)__size);
  if (this_01 != (Persistent_cohomology_cell<unsigned_int,_int> *)0x0) {
    persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>::Persistent_cohomology_cell
              (this_01,*u,*u_1,*u_2);
    return this_01;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/common/include/gudhi/Simple_object_pool.h"
                ,0x33,
                "pointer Gudhi::Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>>::construct(U &&...) [T = Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned int, int>, U = <unsigned int &, int &, Gudhi::persistent_cohomology::Persistent_cohomology_column<unsigned int, int> *&>]"
               );
}

Assistant:

pointer construct(U&&...u) {
    void* p = base().malloc BOOST_PREVENT_MACRO_SUBSTITUTION();
    assert(p);
    try {
      new(p) T(std::forward<U>(u)...);
    }    catch (...) {
      base().free BOOST_PREVENT_MACRO_SUBSTITUTION(p);
      throw;
    }
    return static_cast<pointer> (p);
  }